

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

void GPU_PushErrorCode(char *function,GPU_ErrorEnum error,char *details,...)

{
  char in_AL;
  GPU_DebugLevelEnum GVar1;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *local_330;
  char *local_320;
  undefined1 local_318 [24];
  undefined8 local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 local_2d8;
  undefined8 local_2c8;
  undefined8 local_2b8;
  undefined8 local_2a8;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined4 local_268;
  undefined4 local_264;
  va_list lst_1;
  undefined4 local_248;
  undefined4 local_244;
  va_list lst;
  char local_228 [8];
  char buf [512];
  char *details_local;
  GPU_ErrorEnum error_local;
  char *function_local;
  
  if (in_AL != '\0') {
    local_2e8 = in_XMM0_Qa;
    local_2d8 = in_XMM1_Qa;
    local_2c8 = in_XMM2_Qa;
    local_2b8 = in_XMM3_Qa;
    local_2a8 = in_XMM4_Qa;
    local_298 = in_XMM5_Qa;
    local_288 = in_XMM6_Qa;
    local_278 = in_XMM7_Qa;
  }
  local_300 = in_RCX;
  local_2f8 = in_R8;
  local_2f0 = in_R9;
  gpu_init_error_queue();
  GVar1 = GPU_GetDebugLevel();
  if (GVar1 != GPU_DEBUG_LEVEL_0) {
    if (details == (char *)0x0) {
      local_330 = function;
      if (function == (char *)0x0) {
        local_330 = "NULL";
      }
      pcVar2 = GPU_GetErrorString(error);
      GPU_LogError("%s: %s\n",local_330,pcVar2);
    }
    else {
      lst[0].overflow_arg_area = local_318;
      lst[0]._0_8_ = &stack0x00000008;
      local_244 = 0x30;
      local_248 = 0x18;
      vsnprintf(local_228,0x200,details,&local_248);
      local_320 = function;
      if (function == (char *)0x0) {
        local_320 = "NULL";
      }
      pcVar2 = GPU_GetErrorString(error);
      GPU_LogError("%s: %s - %s\n",local_320,pcVar2,local_228);
    }
  }
  if (_gpu_num_error_codes < _gpu_error_code_queue_size) {
    if (function == (char *)0x0) {
      *_gpu_error_code_queue[_gpu_num_error_codes].function = '\0';
    }
    else {
      strncpy(_gpu_error_code_queue[_gpu_num_error_codes].function,function,0x80);
      _gpu_error_code_queue[_gpu_num_error_codes].function[0x80] = '\0';
    }
    _gpu_error_code_queue[_gpu_num_error_codes].error = error;
    if (details == (char *)0x0) {
      *_gpu_error_code_queue[_gpu_num_error_codes].details = '\0';
    }
    else {
      lst_1[0].overflow_arg_area = local_318;
      lst_1[0]._0_8_ = &stack0x00000008;
      local_264 = 0x30;
      local_268 = 0x18;
      vsnprintf(_gpu_error_code_queue[_gpu_num_error_codes].details,0x200,details,&local_268);
    }
    _gpu_num_error_codes = _gpu_num_error_codes + 1;
  }
  return;
}

Assistant:

void GPU_PushErrorCode(const char* function, GPU_ErrorEnum error, const char* details, ...)
{
    gpu_init_error_queue();

    if(GPU_GetDebugLevel() >= GPU_DEBUG_LEVEL_1)
    {
        // Print the message
        if(details != NULL)
        {
            char buf[GPU_ERROR_DETAILS_STRING_MAX];
            va_list lst;
            va_start(lst, details);
            vsnprintf(buf, GPU_ERROR_DETAILS_STRING_MAX, details, lst);
            va_end(lst);

            GPU_LogError("%s: %s - %s\n", (function == NULL? "NULL" : function), GPU_GetErrorString(error), buf);
        }
        else
            GPU_LogError("%s: %s\n", (function == NULL? "NULL" : function), GPU_GetErrorString(error));
    }

    if(_gpu_num_error_codes < _gpu_error_code_queue_size)
    {
        if(function == NULL)
            _gpu_error_code_queue[_gpu_num_error_codes].function[0] = '\0';
        else
        {
            strncpy(_gpu_error_code_queue[_gpu_num_error_codes].function, function, GPU_ERROR_FUNCTION_STRING_MAX);
            _gpu_error_code_queue[_gpu_num_error_codes].function[GPU_ERROR_FUNCTION_STRING_MAX] = '\0';
        }
        _gpu_error_code_queue[_gpu_num_error_codes].error = error;
        if(details == NULL)
            _gpu_error_code_queue[_gpu_num_error_codes].details[0] = '\0';
        else
        {
            va_list lst;
            va_start(lst, details);
            vsnprintf(_gpu_error_code_queue[_gpu_num_error_codes].details, GPU_ERROR_DETAILS_STRING_MAX, details, lst);
            va_end(lst);
        }
        _gpu_num_error_codes++;
    }
}